

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::ParseTransform(cmDependsC *this,string *xform)

{
  long lVar1;
  mapped_type *pmVar2;
  string value;
  string name;
  
  lVar1 = std::__cxx11::string::find((char *)xform,0x43cc44);
  if (1 < lVar1 + 1U) {
    std::__cxx11::string::substr((ulong)&name,(ulong)xform);
    std::__cxx11::string::substr((ulong)&value,(ulong)xform);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->TransformRules,&name);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void cmDependsC::ParseTransform(std::string const& xform)
{
  // A transform rule is of the form SOME_MACRO(%)=value-with-%
  // We can simply separate with "(%)=".
  std::string::size_type pos = xform.find("(%)=");
  if (pos == std::string::npos || pos == 0) {
    return;
  }
  std::string name = xform.substr(0, pos);
  std::string value = xform.substr(pos + 4);
  this->TransformRules[name] = value;
}